

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_bpf_get_heap_size(ma_bpf_config *pConfig,size_t *pHeapSizeInBytes)

{
  undefined1 local_38 [8];
  ma_bpf_heap_layout heapLayout;
  ma_result result;
  size_t *pHeapSizeInBytes_local;
  ma_bpf_config *pConfig_local;
  
  if (pHeapSizeInBytes == (size_t *)0x0) {
    pConfig_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    *pHeapSizeInBytes = 0;
    pConfig_local._4_4_ = ma_bpf_get_heap_layout(pConfig,(ma_bpf_heap_layout *)local_38);
    if (pConfig_local._4_4_ == MA_SUCCESS) {
      *pHeapSizeInBytes = (size_t)local_38;
      pConfig_local._4_4_ = MA_SUCCESS;
    }
  }
  return pConfig_local._4_4_;
}

Assistant:

MA_API ma_result ma_bpf_get_heap_size(const ma_bpf_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_result result;
    ma_bpf_heap_layout heapLayout;

    if (pHeapSizeInBytes == NULL) {
        return MA_INVALID_ARGS;
    }

    *pHeapSizeInBytes = 0;

    result = ma_bpf_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    *pHeapSizeInBytes = heapLayout.sizeInBytes;

    return MA_SUCCESS;
}